

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::deleteTexture(ReferenceContext *this,Texture *texture)

{
  pointer pTVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  int iVar4;
  int iVar5;
  int point;
  long lVar6;
  Framebuffer *pFVar7;
  int unitNdx;
  long lVar8;
  Attachment *attachment;
  bool bVar9;
  
  lVar6 = 0x28;
  lVar8 = 0;
  while( true ) {
    pTVar1 = (this->m_textureUnits).
             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_textureUnits).
                     super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x3cb8) <= lVar8)
    break;
    iVar4 = (int)lVar8;
    if (*(Texture **)((long)pTVar1 + lVar6 + -0x28) == texture) {
      setTex1DBinding(this,iVar4,(Texture1D *)0x0);
    }
    else if (*(Texture **)((long)pTVar1 + lVar6 + -0x20) == texture) {
      setTex2DBinding(this,iVar4,(Texture2D *)0x0);
    }
    else if (*(Texture **)((long)pTVar1 + lVar6 + -0x18) == texture) {
      setTexCubeBinding(this,iVar4,(TextureCube *)0x0);
    }
    else if (*(Texture **)((long)pTVar1 + lVar6 + -0x10) == texture) {
      setTex2DArrayBinding(this,iVar4,(Texture2DArray *)0x0);
    }
    else if (*(Texture **)((long)pTVar1 + lVar6 + -8) == texture) {
      setTex3DBinding(this,iVar4,(Texture3D *)0x0);
    }
    else if (*(Texture **)((long)&pTVar1->tex1DBinding + lVar6) == texture) {
      setTexCubeArrayBinding(this,iVar4,(TextureCubeArray *)0x0);
    }
    lVar8 = lVar8 + 1;
    lVar6 = lVar6 + 0x3cb8;
  }
  for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
    pFVar2 = this->m_readFramebufferBinding;
    pFVar3 = this->m_drawFramebufferBinding;
    pFVar7 = pFVar3;
    if (iVar4 == 0) {
      pFVar7 = pFVar2;
    }
    if (pFVar7 != (Framebuffer *)0x0) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        if (pFVar7->m_attachments[lVar6].name == (texture->super_NamedObject).m_name) {
          attachment = pFVar7->m_attachments + lVar6;
          iVar5 = (uint)(pFVar7 == pFVar2) + (uint)(pFVar7 == pFVar3);
          while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
            releaseFboAttachmentReference(this,attachment);
          }
          attachment->type = ATTACHMENTTYPE_LAST;
          attachment->name = 0;
          attachment->texTarget = TEXTARGET_LAST;
          attachment->level = 0;
          attachment->layer = 0;
        }
      }
    }
  }
  rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,texture);
  return;
}

Assistant:

void ReferenceContext::deleteTexture (Texture* texture)
{
	// Unbind from context
	for (int unitNdx = 0; unitNdx < (int)m_textureUnits.size(); unitNdx++)
	{
		if (m_textureUnits[unitNdx].tex1DBinding				== texture)	setTex1DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DBinding			== texture)	setTex2DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeBinding			== texture)	setTexCubeBinding		(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DArrayBinding		== texture)	setTex2DArrayBinding	(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex3DBinding			== texture)	setTex3DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeArrayBinding	== texture)	setTexCubeArrayBinding	(unitNdx, DE_NULL);
	}

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == texture->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(texture->getRefCount() == 1);
	m_textures.releaseReference(texture);
}